

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

void __thiscall glslang::TVariable::dump(TVariable *this,TInfoSink *infoSink,bool complete)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  TInfoSinkBase *pTVar4;
  undefined4 extraout_var_00;
  TString local_d0;
  pool_allocator<char> local_a8;
  TString local_a0;
  pool_allocator<char> local_78;
  TString local_70;
  TString local_48;
  undefined1 local_19;
  TInfoSink *pTStack_18;
  bool complete_local;
  TInfoSink *infoSink_local;
  TVariable *this_local;
  
  local_19 = complete;
  pTStack_18 = infoSink;
  infoSink_local = (TInfoSink *)this;
  if (complete) {
    iVar2 = (*(this->super_TSymbol)._vptr_TSymbol[3])();
    pcVar3 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var,iVar2));
    pTVar4 = TInfoSinkBase::operator<<(&infoSink->debug,pcVar3);
    pTVar4 = TInfoSinkBase::operator<<(pTVar4,": ");
    pool_allocator<char>::pool_allocator(&local_78);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_70,
               "",&local_78);
    pool_allocator<char>::pool_allocator(&local_a8);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_a0,
               "",&local_a8);
    TType::getCompleteString(&local_48,&this->type,false,true,true,true,&local_70,&local_a0);
    TInfoSinkBase::operator<<(pTVar4,&local_48);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_48);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_a0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_70);
    TSymbol::dumpExtensions(&this->super_TSymbol,pTStack_18);
  }
  else {
    iVar2 = (*(this->super_TSymbol)._vptr_TSymbol[3])();
    pcVar3 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_00,iVar2));
    pTVar4 = TInfoSinkBase::operator<<(&infoSink->debug,pcVar3);
    pTVar4 = TInfoSinkBase::operator<<(pTVar4,": ");
    pcVar3 = TType::getStorageQualifierString(&this->type);
    pTVar4 = TInfoSinkBase::operator<<(pTVar4,pcVar3);
    pTVar4 = TInfoSinkBase::operator<<(pTVar4," ");
    TType::getBasicTypeString_abi_cxx11_(&local_d0,&this->type);
    TInfoSinkBase::operator<<(pTVar4,&local_d0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_d0);
    bVar1 = TType::isArray(&this->type);
    if (bVar1) {
      TInfoSinkBase::operator<<(&pTStack_18->debug,"[0]");
    }
  }
  TInfoSinkBase::operator<<(&pTStack_18->debug,"\n");
  return;
}

Assistant:

void TVariable::dump(TInfoSink& infoSink, bool complete) const
{
    if (complete) {
        infoSink.debug << getName().c_str() << ": " << type.getCompleteString();
        dumpExtensions(infoSink);
    } else {
        infoSink.debug << getName().c_str() << ": " << type.getStorageQualifierString() << " "
                       << type.getBasicTypeString();

        if (type.isArray())
            infoSink.debug << "[0]";
    }

    infoSink.debug << "\n";
}